

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_WAVEPACKET14_v3::~LASreadItemCompressed_WAVEPACKET14_v3
          (LASreadItemCompressed_WAVEPACKET14_v3 *this)

{
  ArithmeticModel *m;
  IntegerCompressor *pIVar1;
  ArithmeticDecoder *this_00;
  long lVar2;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015fb18;
  for (lVar2 = 0; lVar2 != 0x1c0; lVar2 = lVar2 + 0x70) {
    m = *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + -8);
    if (m != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_wavepacket,m);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 8));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x10));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_wavepacket,
                 *(ArithmeticModel **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x18));
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x20);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x28);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x30);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
      pIVar1 = *(IntegerCompressor **)((long)this->contexts[0].m_offset_diff + lVar2 + 0x38);
      if (pIVar1 != (IntegerCompressor *)0x0) {
        IntegerCompressor::~IntegerCompressor(pIVar1);
      }
      operator_delete(pIVar1);
    }
  }
  if (this->instream_wavepacket != (ByteStreamInArray *)0x0) {
    (*(this->instream_wavepacket->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    this_00 = this->dec_wavepacket;
    if (this_00 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(this_00);
    }
    operator_delete(this_00);
  }
  if (this->bytes != (U8 *)0x0) {
    operator_delete__(this->bytes);
    return;
  }
  return;
}

Assistant:

LASreadItemCompressed_WAVEPACKET14_v3::~LASreadItemCompressed_WAVEPACKET14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_packet_index)
    {
      dec_wavepacket->destroySymbolModel(contexts[c].m_packet_index);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[0]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[1]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[2]);
      dec_wavepacket->destroySymbolModel(contexts[c].m_offset_diff[3]);
      delete contexts[c].ic_offset_diff;
      delete contexts[c].ic_packet_size;
      delete contexts[c].ic_return_point;
      delete contexts[c].ic_xyz;
    }
  }

  /* destroy all instreams and decoders */

  if (instream_wavepacket)
  {
    delete instream_wavepacket;

    delete dec_wavepacket;
  }

  if (bytes) delete [] bytes;
}